

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Program.cpp
# Opt level: O3

ProcessInfo
llvm::sys::ExecuteNoWait
          (StringRef Program,ArrayRef<llvm::StringRef> Args,
          Optional<llvm::ArrayRef<llvm::StringRef>_> Env,
          ArrayRef<llvm::Optional<llvm::StringRef>_> Redirects,uint MemoryLimit,string *ErrMsg,
          bool *ExecutionFailed)

{
  ArrayRef<llvm::Optional<llvm::StringRef>_> Redirects_00;
  bool bVar1;
  size_type sVar2;
  ArrayRef<llvm::StringRef> Args_00;
  ProcessInfo PI;
  undefined4 in_stack_ffffffffffffff9c;
  ProcessInfo local_50;
  size_type local_40;
  Optional<llvm::StringRef> *local_38;
  
  sVar2 = Redirects.Length;
  local_38 = Redirects.Data;
  local_40 = Args.Length;
  if ((sVar2 != 0) && (sVar2 != 3)) {
    __assert_fail("Redirects.empty() || Redirects.size() == 3",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/Program.cpp"
                  ,0x39,
                  "ProcessInfo llvm::sys::ExecuteNoWait(StringRef, ArrayRef<StringRef>, Optional<ArrayRef<StringRef>>, ArrayRef<Optional<StringRef>>, unsigned int, std::string *, bool *)"
                 );
  }
  ProcessInfo::ProcessInfo(&local_50);
  if (ExecutionFailed != (bool *)0x0) {
    *ExecutionFailed = false;
  }
  Redirects_00.Length._0_4_ = MemoryLimit;
  Redirects_00.Data = (Optional<llvm::StringRef> *)sVar2;
  Redirects_00.Length._4_4_ = in_stack_ffffffffffffff9c;
  Args_00.Length = local_40;
  Args_00.Data = Args.Data;
  bVar1 = Execute(&local_50,Program,Args_00,Env,Redirects_00,(uint)local_38,ErrMsg);
  if ((ExecutionFailed != (bool *)0x0) && (!bVar1)) {
    *ExecutionFailed = true;
  }
  return local_50;
}

Assistant:

ProcessInfo sys::ExecuteNoWait(StringRef Program, ArrayRef<StringRef> Args,
                               Optional<ArrayRef<StringRef>> Env,
                               ArrayRef<Optional<StringRef>> Redirects,
                               unsigned MemoryLimit, std::string *ErrMsg,
                               bool *ExecutionFailed) {
  assert(Redirects.empty() || Redirects.size() == 3);
  ProcessInfo PI;
  if (ExecutionFailed)
    *ExecutionFailed = false;
  if (!Execute(PI, Program, Args, Env, Redirects, MemoryLimit, ErrMsg))
    if (ExecutionFailed)
      *ExecutionFailed = true;

  return PI;
}